

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O0

int __thiscall despot::Pocman::MakeObservations(Pocman *this,PocmanState *pocstate)

{
  bool bVar1;
  int iVar2;
  long local_28;
  Coord wpos;
  int local_1c;
  int d;
  int observation;
  PocmanState *pocstate_local;
  Pocman *this_local;
  
  local_1c = 0;
  _d = pocstate;
  pocstate_local = (PocmanState *)this;
  for (_wpos = 0; _wpos < 4; _wpos = _wpos + 1) {
    iVar2 = SeeGhost(this,_d,_wpos);
    if (-1 < iVar2) {
      SetFlag(&local_1c,_wpos);
    }
    local_28 = NextPos(this,&_d->pocman_pos,_wpos);
    if (((-1 < (int)local_28) && (-1 < local_28)) &&
       (bVar1 = Passable(this,(Coord *)&local_28), bVar1)) {
      SetFlag(&local_1c,_wpos + 4);
    }
  }
  bVar1 = SmellFood(this,_d);
  if (bVar1) {
    SetFlag(&local_1c,8);
  }
  bVar1 = HearGhost(this,_d);
  if (bVar1) {
    SetFlag(&local_1c,9);
  }
  return local_1c;
}

Assistant:

int Pocman::MakeObservations(const PocmanState& pocstate) const {
	int observation = 0;
	for (int d = 0; d < 4; d++) {
		if (SeeGhost(pocstate, d) >= 0)
			SetFlag(observation, d);
		Coord wpos = NextPos(pocstate.pocman_pos, d);
		if (wpos.x >= 0 && wpos.y >= 0 && Passable(wpos))
			SetFlag(observation, d + 4);
	}
	if (SmellFood(pocstate))
		SetFlag(observation, 8);
	if (HearGhost(pocstate))
		SetFlag(observation, 9);
	return observation;
}